

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O2

kd_tree_data_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,128ul>
::operator()(kd_tree_data_type *__return_storage_ptr__,void *this,
            space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
            space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *param_4)

{
  node *pnVar1;
  pointer piVar2;
  node_type *pnVar3;
  int iVar4;
  vector<int,_std::allocator<int>_> indices;
  node_allocator_type allocator;
  box_type root_box;
  space_type local_490;
  _Vector_base<int,_std::allocator<int>_> local_488;
  node_allocator_type local_470;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_128UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>
  local_450;
  box_type local_428;
  
  local_490.space_ = space.space_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_488,
             (size_type)
             ((space.space_)->
             super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start,(allocator_type *)&local_428);
  iVar4 = 0;
  for (piVar2 = local_488._M_impl.super__Vector_impl_data._M_start;
      piVar2 != local_488._M_impl.super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    *piVar2 = iVar4;
    iVar4 = iVar4 + 1;
  }
  box_from_bounds<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,128ul>>>
            (&local_428,this,space.space_);
  local_450.allocator_ = &local_470;
  local_470.resource_._vptr_list_pool_resource = (_func_int **)&PTR__list_pool_resource_00112d80;
  local_470.resource_.head_ = (node *)0x0;
  local_470.object_index_ = 0x100;
  local_450.stop_value_ = *(index_type *)stop_condition;
  local_450.space_ = &local_490;
  local_450.splitter_.space_.space_ =
       (space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
        )(space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
          )space.space_;
  local_450.indices_ = (vector<int,_std::allocator<int>_> *)&local_488;
  pnVar3 = build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_128UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>
           ::operator()(&local_450,&local_428);
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_488._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = local_488._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_488._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_488._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memcpy(&__return_storage_ptr__->root_box,&local_428,0x400);
  pnVar1 = local_470.resource_.head_;
  (__return_storage_ptr__->allocator).resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00112d80;
  local_470.resource_.head_ = (node *)0x0;
  (__return_storage_ptr__->allocator).resource_.head_ = pnVar1;
  (__return_storage_ptr__->allocator).object_index_ = local_470.object_index_;
  (__return_storage_ptr__->allocator).chunk_ = local_470.chunk_;
  __return_storage_ptr__->root_node = pnVar3;
  list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::
  ~list_pool_resource(&local_470.resource_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_488);
  return __return_storage_ptr__;
}

Assistant:

kd_tree_data_type operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const&) {
    static_assert(
        std::is_same_v<scalar_type, typename SpaceWrapper_::scalar_type>);
    static_assert(Dim_ == SpaceWrapper_::dim);
    assert(space.size() > 0);

    using build_kd_tree_impl_type =
        build_kd_tree_impl<SpaceWrapper_, Stop_, Rule_, kd_tree_data_type>;
    using node_allocator_type = typename kd_tree_data_type::node_allocator_type;

    std::vector<index_type> indices(space.size());
    std::iota(indices.begin(), indices.end(), 0);
    box_type root_box = box_from_bounds(space, start_bounds.derived());
    node_allocator_type allocator;
    node_type* root_node = build_kd_tree_impl_type{
        space, stop_condition.derived().value, indices, allocator}(root_box);

    return kd_tree_data_type{
        std::move(indices), root_box, std::move(allocator), root_node};
  }